

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.cpp
# Opt level: O3

void anon_unknown.dwarf_54919::UpdateSourceProps(ALsource *source,Voice *voice,ALCcontext *context)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined4 uVar3;
  long lVar4;
  ALeffectslot *pAVar5;
  undefined8 uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  Resampler RVar10;
  SpatializeMode SVar11;
  bool bVar12;
  __pointer_type pVVar13;
  long lVar14;
  __pointer_type pVVar15;
  __pointer_type pVVar16;
  long lVar17;
  bool bVar18;
  
  pVVar13 = (context->mFreeVoiceProps)._M_b._M_p;
  if (pVVar13 == (__pointer_type)0x0) {
    pVVar13 = (__pointer_type)VoicePropsItem::operator_new((VoicePropsItem *)0x170,(size_t)voice);
    memset(pVVar13,0,0x170);
  }
  else {
    pVVar16 = (pVVar13->next)._M_b._M_p;
    while( true ) {
      LOCK();
      pVVar15 = (context->mFreeVoiceProps)._M_b._M_p;
      bVar18 = pVVar13 == pVVar15;
      if (bVar18) {
        (context->mFreeVoiceProps)._M_b._M_p = pVVar16;
        pVVar15 = pVVar13;
      }
      UNLOCK();
      if (bVar18) break;
      pVVar16 = (pVVar15->next)._M_b._M_p;
      pVVar13 = pVVar15;
    }
  }
  fVar7 = source->Gain;
  fVar8 = source->OuterGain;
  fVar9 = source->MinGain;
  (pVVar13->super_VoiceProps).Pitch = source->Pitch;
  (pVVar13->super_VoiceProps).Gain = fVar7;
  (pVVar13->super_VoiceProps).OuterGain = fVar8;
  (pVVar13->super_VoiceProps).MinGain = fVar9;
  fVar7 = source->InnerAngle;
  fVar8 = source->OuterAngle;
  fVar9 = source->RefDistance;
  (pVVar13->super_VoiceProps).MaxGain = source->MaxGain;
  (pVVar13->super_VoiceProps).InnerAngle = fVar7;
  (pVVar13->super_VoiceProps).OuterAngle = fVar8;
  (pVVar13->super_VoiceProps).RefDistance = fVar9;
  fVar7 = source->RolloffFactor;
  (pVVar13->super_VoiceProps).MaxDistance = source->MaxDistance;
  (pVVar13->super_VoiceProps).RolloffFactor = fVar7;
  (pVVar13->super_VoiceProps).Position._M_elems[2] = (source->Position)._M_elems[2];
  *(undefined8 *)(pVVar13->super_VoiceProps).Position._M_elems =
       *(undefined8 *)(source->Position)._M_elems;
  (pVVar13->super_VoiceProps).Velocity._M_elems[2] = (source->Velocity)._M_elems[2];
  *(undefined8 *)(pVVar13->super_VoiceProps).Velocity._M_elems =
       *(undefined8 *)(source->Velocity)._M_elems;
  (pVVar13->super_VoiceProps).Direction._M_elems[2] = (source->Direction)._M_elems[2];
  *(undefined8 *)(pVVar13->super_VoiceProps).Direction._M_elems =
       *(undefined8 *)(source->Direction)._M_elems;
  (pVVar13->super_VoiceProps).OrientAt._M_elems[2] = (source->OrientAt)._M_elems[2];
  *(undefined8 *)(pVVar13->super_VoiceProps).OrientAt._M_elems =
       *(undefined8 *)(source->OrientAt)._M_elems;
  (pVVar13->super_VoiceProps).OrientUp._M_elems[2] = (source->OrientUp)._M_elems[2];
  *(undefined8 *)(pVVar13->super_VoiceProps).OrientUp._M_elems =
       *(undefined8 *)(source->OrientUp)._M_elems;
  (pVVar13->super_VoiceProps).HeadRelative = source->HeadRelative;
  RVar10 = source->mResampler;
  (pVVar13->super_VoiceProps).mDistanceModel = source->mDistanceModel;
  (pVVar13->super_VoiceProps).mResampler = RVar10;
  SVar11 = source->mSpatialize;
  bVar18 = source->DryGainHFAuto;
  bVar12 = source->WetGainAuto;
  (pVVar13->super_VoiceProps).DirectChannels = source->DirectChannels;
  (pVVar13->super_VoiceProps).mSpatializeMode = SVar11;
  (pVVar13->super_VoiceProps).DryGainHFAuto = bVar18;
  (pVVar13->super_VoiceProps).WetGainAuto = bVar12;
  (pVVar13->super_VoiceProps).WetGainHFAuto = source->WetGainHFAuto;
  fVar7 = source->AirAbsorptionFactor;
  fVar8 = source->RoomRolloffFactor;
  fVar9 = source->DopplerFactor;
  (pVVar13->super_VoiceProps).OuterGainHF = source->OuterGainHF;
  (pVVar13->super_VoiceProps).AirAbsorptionFactor = fVar7;
  (pVVar13->super_VoiceProps).RoomRolloffFactor = fVar8;
  (pVVar13->super_VoiceProps).DopplerFactor = fVar9;
  *(undefined8 *)(pVVar13->super_VoiceProps).StereoPan._M_elems =
       *(undefined8 *)(source->StereoPan)._M_elems;
  fVar7 = (source->Direct).Gain;
  fVar8 = (source->Direct).GainHF;
  fVar9 = (source->Direct).HFReference;
  (pVVar13->super_VoiceProps).Radius = source->Radius;
  (pVVar13->super_VoiceProps).Direct.Gain = fVar7;
  (pVVar13->super_VoiceProps).Direct.GainHF = fVar8;
  (pVVar13->super_VoiceProps).Direct.HFReference = fVar9;
  fVar7 = (source->Direct).LFReference;
  (pVVar13->super_VoiceProps).Direct.GainLF = (source->Direct).GainLF;
  (pVVar13->super_VoiceProps).Direct.LFReference = fVar7;
  lVar14 = 0;
  do {
    lVar4 = *(long *)((long)&(source->Send)._M_elems[0].Slot + lVar14);
    lVar17 = lVar4 + 0xa0;
    if (lVar4 == 0) {
      lVar17 = 0;
    }
    uVar3 = *(undefined4 *)((long)&(source->Send)._M_elems[0].LFReference + lVar14);
    *(long *)((long)&(pVVar13->super_VoiceProps).Send[0].Slot + lVar14) = lVar17;
    puVar1 = (undefined8 *)((long)&(source->Send)._M_elems[0].Gain + lVar14);
    uVar6 = puVar1[1];
    puVar2 = (undefined8 *)((long)&(pVVar13->super_VoiceProps).Send[0].Gain + lVar14);
    *puVar2 = *puVar1;
    puVar2[1] = uVar6;
    *(undefined4 *)((long)&(pVVar13->super_VoiceProps).Send[0].LFReference + lVar14) = uVar3;
    *(undefined4 *)(&(pVVar13->super_VoiceProps).Send[0].field_0x1c + lVar14) = 0;
    lVar14 = lVar14 + 0x20;
  } while (lVar14 != 0xc0);
  if (((pVVar13->super_VoiceProps).Send[0].Slot == (EffectSlot *)0x0) &&
     (pAVar5 = (context->mDefaultSlot)._M_t.
               super___uniq_ptr_impl<ALeffectslot,_std::default_delete<ALeffectslot>_>._M_t.
               super__Tuple_impl<0UL,_ALeffectslot_*,_std::default_delete<ALeffectslot>_>.
               super__Head_base<0UL,_ALeffectslot_*,_false>._M_head_impl,
     pAVar5 != (ALeffectslot *)0x0)) {
    (pVVar13->super_VoiceProps).Send[0].Slot = &pAVar5->mSlot;
  }
  LOCK();
  pVVar16 = (voice->mUpdate)._M_b._M_p;
  (voice->mUpdate)._M_b._M_p = pVVar13;
  UNLOCK();
  if (pVVar16 != (__pointer_type)0x0) {
    pVVar13 = (context->mFreeVoiceProps)._M_b._M_p;
    do {
      (pVVar16->next)._M_b._M_p = pVVar13;
      LOCK();
      pVVar15 = (context->mFreeVoiceProps)._M_b._M_p;
      bVar18 = pVVar13 == pVVar15;
      if (bVar18) {
        (context->mFreeVoiceProps)._M_b._M_p = pVVar16;
        pVVar15 = pVVar13;
      }
      UNLOCK();
      pVVar13 = pVVar15;
    } while (!bVar18);
  }
  return;
}

Assistant:

void UpdateSourceProps(const ALsource *source, Voice *voice, ALCcontext *context)
{
    /* Get an unused property container, or allocate a new one as needed. */
    VoicePropsItem *props{context->mFreeVoiceProps.load(std::memory_order_acquire)};
    if(!props)
        props = new VoicePropsItem{};
    else
    {
        VoicePropsItem *next;
        do {
            next = props->next.load(std::memory_order_relaxed);
        } while(context->mFreeVoiceProps.compare_exchange_weak(props, next,
                std::memory_order_acq_rel, std::memory_order_acquire) == 0);
    }

    props->Pitch = source->Pitch;
    props->Gain = source->Gain;
    props->OuterGain = source->OuterGain;
    props->MinGain = source->MinGain;
    props->MaxGain = source->MaxGain;
    props->InnerAngle = source->InnerAngle;
    props->OuterAngle = source->OuterAngle;
    props->RefDistance = source->RefDistance;
    props->MaxDistance = source->MaxDistance;
    props->RolloffFactor = source->RolloffFactor;
    props->Position = source->Position;
    props->Velocity = source->Velocity;
    props->Direction = source->Direction;
    props->OrientAt = source->OrientAt;
    props->OrientUp = source->OrientUp;
    props->HeadRelative = source->HeadRelative;
    props->mDistanceModel = source->mDistanceModel;
    props->mResampler = source->mResampler;
    props->DirectChannels = source->DirectChannels;
    props->mSpatializeMode = source->mSpatialize;

    props->DryGainHFAuto = source->DryGainHFAuto;
    props->WetGainAuto = source->WetGainAuto;
    props->WetGainHFAuto = source->WetGainHFAuto;
    props->OuterGainHF = source->OuterGainHF;

    props->AirAbsorptionFactor = source->AirAbsorptionFactor;
    props->RoomRolloffFactor = source->RoomRolloffFactor;
    props->DopplerFactor = source->DopplerFactor;

    props->StereoPan = source->StereoPan;

    props->Radius = source->Radius;

    props->Direct.Gain = source->Direct.Gain;
    props->Direct.GainHF = source->Direct.GainHF;
    props->Direct.HFReference = source->Direct.HFReference;
    props->Direct.GainLF = source->Direct.GainLF;
    props->Direct.LFReference = source->Direct.LFReference;

    auto copy_send = [](const ALsource::SendData &srcsend) noexcept -> VoiceProps::SendData
    {
        VoiceProps::SendData ret{};
        ret.Slot = srcsend.Slot ? &srcsend.Slot->mSlot : nullptr;
        ret.Gain = srcsend.Gain;
        ret.GainHF = srcsend.GainHF;
        ret.HFReference = srcsend.HFReference;
        ret.GainLF = srcsend.GainLF;
        ret.LFReference = srcsend.LFReference;
        return ret;
    };
    std::transform(source->Send.cbegin(), source->Send.cend(), props->Send, copy_send);
    if(!props->Send[0].Slot && context->mDefaultSlot)
        props->Send[0].Slot = &context->mDefaultSlot->mSlot;

    /* Set the new container for updating internal parameters. */
    props = voice->mUpdate.exchange(props, std::memory_order_acq_rel);
    if(props)
    {
        /* If there was an unused update container, put it back in the
         * freelist.
         */
        AtomicReplaceHead(context->mFreeVoiceProps, props);
    }
}